

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_int csc2csr(CUPDLPcsr *csr,CUPDLPcsc *csc)

{
  cupdlp_dcs *pcVar1;
  long in_RSI;
  int *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  cupdlp_dcs *cs_csr;
  cupdlp_dcs *cs_csc;
  int in_stack_00000034;
  cupdlp_dcs *in_stack_00000038;
  cupdlp_dcs *in_stack_ffffffffffffffd8;
  
  pcVar1 = cupdlp_dcs_spalloc(cs_csr._4_4_,(int)cs_csr,unaff_retaddr_00,unaff_retaddr,
                              (int)((ulong)in_RDI >> 0x20));
  memcpy(pcVar1->p,*(void **)(in_RSI + 0x10),(long)(*(int *)(in_RSI + 4) + 1) << 2);
  memcpy(pcVar1->i,*(void **)(in_RSI + 0x18),(long)*(int *)(in_RSI + 8) << 2);
  memcpy(pcVar1->x,*(void **)(in_RSI + 0x20),(long)*(int *)(in_RSI + 8) << 3);
  pcVar1 = cupdlp_dcs_transpose(in_stack_00000038,in_stack_00000034);
  in_RDI[1] = pcVar1->m;
  *in_RDI = pcVar1->n;
  in_RDI[2] = pcVar1->nzmax;
  memcpy(*(void **)(in_RDI + 4),pcVar1->p,(long)(pcVar1->n + 1) << 2);
  memcpy(*(void **)(in_RDI + 6),pcVar1->i,(long)pcVar1->nzmax << 2);
  memcpy(*(void **)(in_RDI + 8),pcVar1->x,(long)pcVar1->nzmax << 3);
  cupdlp_dcs_spfree(in_stack_ffffffffffffffd8);
  cupdlp_dcs_spfree(in_stack_ffffffffffffffd8);
  return 0;
}

Assistant:

cupdlp_int csc2csr(CUPDLPcsr *csr, CUPDLPcsc *csc) {
  // The transpose may need to be done on the GPU
  // Currently, it is done on the CPU

  cupdlp_dcs *cs_csc =
      cupdlp_dcs_spalloc(csc->nRows, csc->nCols, csc->nMatElem, 1, 0);
  cupdlp_copy(cs_csc->p, csc->colMatBeg, cupdlp_int, csc->nCols + 1);
  cupdlp_copy(cs_csc->i, csc->colMatIdx, cupdlp_int, csc->nMatElem);
  cupdlp_copy(cs_csc->x, csc->colMatElem, cupdlp_float, csc->nMatElem);

  cupdlp_dcs *cs_csr = cupdlp_dcs_transpose(cs_csc, 1);
  csr->nCols = cs_csr->m;
  csr->nRows = cs_csr->n;
  csr->nMatElem = cs_csr->nzmax;
  CUPDLP_COPY_VEC(csr->rowMatBeg, cs_csr->p, cupdlp_int, cs_csr->n + 1);
  CUPDLP_COPY_VEC(csr->rowMatIdx, cs_csr->i, cupdlp_int, cs_csr->nzmax);
  CUPDLP_COPY_VEC(csr->rowMatElem, cs_csr->x, cupdlp_float, cs_csr->nzmax);

  // cupdlp_dcs_free(cs_csc);
  // cupdlp_dcs_free(cs_csr);
  cupdlp_dcs_spfree(cs_csc);
  cupdlp_dcs_spfree(cs_csr);

#ifndef CUPDLP_CPU
  // Pointer to GPU csc matrix
  CHECK_CUSPARSE(cusparseCreateCsr(
      &csr->cuda_csr, csr->nRows, csr->nCols, csr->nMatElem, csr->rowMatBeg,
      csr->rowMatIdx, csr->rowMatElem, CUSPARSE_INDEX_32I, CUSPARSE_INDEX_32I,
      CUSPARSE_INDEX_BASE_ZERO, CudaComputeType));
#endif

  return 0;
}